

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::teximage3d_max_level(NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  int iVar1;
  allocator<char> local_69;
  deUint32 log2MaxTextureSize;
  int local_48;
  deUint32 log2Max3DTextureSize;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_3D_TEXTURE_SIZE)."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  iVar1 = NegativeTestContext::getInteger(local_10,0x8073);
  local_48 = ::deLog2Floor32(iVar1);
  local_48 = local_48 + 1;
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x806f,local_48,0x1907,1,1,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log2MaxTextureSize,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).",
             &local_69);
  NegativeTestContext::beginSection(this,(string *)&log2MaxTextureSize);
  std::__cxx11::string::~string((string *)&log2MaxTextureSize);
  std::allocator<char>::~allocator(&local_69);
  iVar1 = NegativeTestContext::getInteger(local_10,0xd33);
  iVar1 = ::deLog2Floor32(iVar1);
  glu::CallLogWrapper::glTexImage3D
            (&local_10->super_CallLogWrapper,0x8c1a,iVar1 + 1,0x1907,1,1,1,0,0x1907,0x1401,
             (void *)0x0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void teximage3d_max_level (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_3D_TEXTURE_SIZE).");
	deUint32 log2Max3DTextureSize = deLog2Floor32(ctx.getInteger(GL_MAX_3D_TEXTURE_SIZE)) + 1;
	ctx.glTexImage3D(GL_TEXTURE_3D, log2Max3DTextureSize, GL_RGB, 1, 1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).");
	deUint32 log2MaxTextureSize = deLog2Floor32(ctx.getInteger(GL_MAX_TEXTURE_SIZE)) + 1;
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, log2MaxTextureSize, GL_RGB, 1, 1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}